

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

string * getEnvironmentVariable(string *__return_storage_ptr__,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  char *__s;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = getenv((name->_M_dataplus)._M_p);
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
  }
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar4]);
      pcVar2[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getEnvironmentVariable(const std::string& name) {
    std::string result;
    const char* value = std::getenv(name.c_str());
    if (value) {
        result = value;
    }
    std::transform(result.begin(), result.end(), result.begin(), ::tolower);
    return result;
}